

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder.cpp
# Opt level: O3

void bidfx_public_api::price::pixie::PriceUpdateDecoder::Visit
               (ByteBuffer *buffer,uint32_t size,IDataDictionary *data_dictionary,Syncable *syncable
               )

{
  uint uVar1;
  uint32_t sid;
  uint uVar2;
  ostream *poVar3;
  invalid_argument *this;
  IDataDictionary *data_dictionary_00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  *this_00;
  stringstream err_msg;
  string local_238;
  undefined7 uStack_237;
  long local_230;
  long local_228 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  local_218;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  local_1e8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  data_dictionary_00 = (IDataDictionary *)syncable;
  if (size != 0) {
    do {
      uVar1 = (**(buffer->super_InputStream)._vptr_InputStream)(buffer);
      sid = tools::Varint::ReadU32(&buffer->super_InputStream);
      uVar2 = uVar1 & 0xff;
      if (uVar2 < 0x67) {
        if (uVar2 != 0x47) {
          if (uVar2 != 0x66) {
LAB_001b0b37:
            std::__cxx11::stringstream::stringstream(local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,"unexpected price update type \'",0x1e);
            local_238 = SUB41(uVar1,0);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_1a8,(char *)&local_238,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
            std::endl<char,std::char_traits<char>>(poVar3);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ERROR] ",8);
            std::__cxx11::stringbuf::str();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)CONCAT71(uStack_237,local_238),local_230);
            if ((long *)CONCAT71(uStack_237,local_238) != local_228) {
              operator_delete((long *)CONCAT71(uStack_237,local_238),local_228[0] + 1);
            }
            this = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::invalid_argument::invalid_argument(this,&local_238);
            __cxa_throw(this,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          this_00 = &local_1e8;
          DecodePriceUpdate_abi_cxx11_
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                      *)this_00,(PriceUpdateDecoder *)buffer,(ByteBuffer *)data_dictionary,
                     data_dictionary_00);
          (**syncable->_vptr_Syncable)(syncable,(ulong)sid,this_00);
LAB_001b0b15:
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
          ::~_Rb_tree(this_00);
        }
      }
      else if (uVar2 != 0x67) {
        if (uVar2 == 0x70) {
          this_00 = &local_218;
          DecodePriceUpdate_abi_cxx11_
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                      *)this_00,(PriceUpdateDecoder *)buffer,(ByteBuffer *)data_dictionary,
                     data_dictionary_00);
          (*syncable->_vptr_Syncable[1])(syncable,(ulong)sid,this_00);
          goto LAB_001b0b15;
        }
        if (uVar2 != 0x73) goto LAB_001b0b37;
        DecodePriceStatus(buffer,sid,syncable);
      }
      size = size - 1;
    } while (size != 0);
  }
  return;
}

Assistant:

void PriceUpdateDecoder::Visit(ByteBuffer& buffer, uint32_t size, IDataDictionary& data_dictionary,
                               Syncable& syncable)
{
    for (uint32_t i = 0; i < size; i++)
    {
        const char type = buffer.ReadByte();
        uint32_t sid = Varint::ReadU32(buffer);
        switch (type)
        {
            case 'f': //FULL (image)
                syncable.PriceImage(sid, DecodePriceUpdate(buffer, data_dictionary));
                break;
            case 'p': // PARTIAL (update)
                syncable.PriceUpdate(sid, DecodePriceUpdate(buffer, data_dictionary));
                break;
            case 's': // STATUS
                DecodePriceStatus(buffer, sid, syncable);
                break;
            case 'G': // FULL GRID IMAGE
                // Grids not supported in cpp api
                break;
            case 'g': // GRID UPDATE
                // Grids not supported in cpp api
                break;
            default:
                std::stringstream err_msg;
                err_msg << "unexpected price update type '" << type << "'" << std::endl;
                std::cout << "[ERROR] " << err_msg.str();
                throw std::invalid_argument(err_msg.str());
        }
    }
}